

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::TaggedPatternSyntax::setChild
          (TaggedPatternSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 uVar1;
  SyntaxNode *pSVar2;
  Token TVar3;
  long lStack_20;
  
  if (index == 2) {
    pSVar2 = TokenOrSyntax::node(&child);
    lStack_20 = 0x38;
    if (pSVar2 == (SyntaxNode *)0x0) {
      pSVar2 = (SyntaxNode *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
    }
  }
  else if (index == 1) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    pSVar2 = (SyntaxNode *)TVar3.info;
    uVar1 = TVar3._0_8_;
    (this->memberName).kind = (short)uVar1;
    (this->memberName).field_0x2 = (char)((ulong)uVar1 >> 0x10);
    (this->memberName).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
    (this->memberName).rawLen = (int)((ulong)uVar1 >> 0x20);
    lStack_20 = 0x30;
  }
  else {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    pSVar2 = (SyntaxNode *)TVar3.info;
    uVar1 = TVar3._0_8_;
    (this->tagged).kind = (short)uVar1;
    (this->tagged).field_0x2 = (char)((ulong)uVar1 >> 0x10);
    (this->tagged).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
    (this->tagged).rawLen = (int)((ulong)uVar1 >> 0x20);
    lStack_20 = 0x20;
  }
  *(SyntaxNode **)((long)&(this->super_PatternSyntax).super_SyntaxNode.kind + lStack_20) = pSVar2;
  return;
}

Assistant:

void TaggedPatternSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: tagged = child.token(); return;
        case 1: memberName = child.token(); return;
        case 2: pattern = child.node() ? &child.node()->as<PatternSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}